

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

MaybeResult<wasm::IRBuilder::HoistedVal> * __thiscall
wasm::IRBuilder::hoistLastValue
          (MaybeResult<wasm::IRBuilder::HoistedVal> *__return_storage_ptr__,IRBuilder *this)

{
  undefined8 *puVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  Type type;
  ScopeCtx *pSVar4;
  Expression *pEVar5;
  LocalSet *pLVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 local_b0 [8];
  Result<unsigned_int> scratchIdx;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  Result<unsigned_int> _val;
  
  pSVar4 = getScope(this);
  ppEVar2 = (pSVar4->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = (pSVar4->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (long)ppEVar3 - (long)ppEVar2 >> 3;
  uVar8 = uVar7 & 0xffffffff;
  uVar10 = uVar7 & 0xffffffff;
  do {
    uVar8 = uVar8 - 1;
    uVar9 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 0) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
       0x20) = '\x01';
      return __return_storage_ptr__;
    }
    uVar11 = (ulong)((uint)uVar8 & 0x7fffffff);
    type.id = (ppEVar2[uVar11]->type).id;
  } while (type.id == 0);
  if (uVar7 - 1 != uVar11) {
    if (type.id != 1) {
      addScratchLocal((Result<unsigned_int> *)local_b0,this,type);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_68,
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_b0);
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),local_68,
                   _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                   super__Move_assign_alias<unsigned_int,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ + (long)local_68
                  );
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                         .super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                         .super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> = puVar1;
        if ((undefined8 *)
            scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
            super__Move_assign_alias<unsigned_int,_wasm::Err>.
            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
            super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ == &local_78) {
          *puVar1 = local_78;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
           + 0x18) = uStack_70;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> =
               scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
           + 0x10) = local_78;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
         8) = local_80;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
         0x20) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_68);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_68);
        _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = &this->builder;
        pLVar6 = Builder::makeLocalSet
                           ((Builder *)
                            _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                            super__Move_assign_alias<unsigned_int,_wasm::Err>.
                            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                            super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,
                            local_b0._0_4_,ppEVar2[uVar11]);
        ppEVar2[uVar11] = (Expression *)pLVar6;
        pEVar5 = (Expression *)
                 MixedArena::allocSpace
                           ((MixedArena *)
                            (*(long *)_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                      super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                                      super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ +
                            0x200),0x18,8);
        pEVar5->_id = LocalGetId;
        *(undefined4 *)(pEVar5 + 1) = local_b0._0_4_;
        (pEVar5->type).id = type.id;
        push(this,pEVar5);
        *(uint *)&(__return_storage_ptr__->val).
                  super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> =
             uVar9;
        *(Expression **)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
         8) = pEVar5;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
         0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_b0);
      return __return_storage_ptr__;
    }
    if ((ppEVar3[-1]->type).id != 1) {
      pEVar5 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
      pEVar5->_id = UnreachableId;
      (pEVar5->type).id = 1;
      push(this,pEVar5);
    }
  }
  *(uint *)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> = uVar9
  ;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 8) = 0
  ;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 0x20)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<IRBuilder::HoistedVal> IRBuilder::hoistLastValue() {
  auto& stack = getScope().exprStack;
  int index = stack.size() - 1;
  for (; index >= 0; --index) {
    if (stack[index]->type != Type::none) {
      break;
    }
  }
  if (index < 0) {
    // There is no value-producing or unreachable expression.
    return {};
  }
  if (unsigned(index) == stack.size() - 1) {
    // Value-producing expression already on top of the stack.
    return HoistedVal{Index(index), nullptr};
  }
  auto*& expr = stack[index];
  auto type = expr->type;
  if (type == Type::unreachable) {
    // Make sure the top of the stack also has an unreachable expression.
    if (stack.back()->type != Type::unreachable) {
      push(builder.makeUnreachable());
    }
    return HoistedVal{Index(index), nullptr};
  }
  // Hoist with a scratch local.
  auto scratchIdx = addScratchLocal(type);
  CHECK_ERR(scratchIdx);
  expr = builder.makeLocalSet(*scratchIdx, expr);
  auto* get = builder.makeLocalGet(*scratchIdx, type);
  push(get);
  return HoistedVal{Index(index), get};
}